

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mask.c
# Opt level: O3

int mask_intersect(uint32_t *a,uint32_t *b,int size)

{
  ulong uVar1;
  int j;
  uint uVar2;
  
  if (0 < size) {
    uVar1 = 0;
    do {
      if ((b[uVar1] & a[uVar1]) != 0) {
        uVar2 = 0;
        do {
          if (((b[uVar1] & a[uVar1]) >> (uVar2 & 0x1f) & 1) != 0) {
            return uVar2;
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != 0x20);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != size + 0x1fU >> 5);
  }
  return -1;
}

Assistant:

int mask_intersect(uint32_t *a, uint32_t *b, int size) {
	int rsize = MASK_SIZE(size);
	int i;
	for (i = 0; i < rsize; i++)
		if (a[i] & b[i]) {
			int j;
			for (j = 0; j < MASK_CHUNK_SIZE; j++)
				if (a[i] & b[i] & (uint32_t)1 << j)
					return j;
		}
	return -1;
}